

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* load(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       *__return_storage_ptr__,istream *in,int col_offset)

{
  pointer pvVar1;
  istream *piVar2;
  int iVar3;
  bool bVar4;
  double local_1f8;
  string token;
  string line;
  istringstream lin;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  if (col_offset < 1) {
    col_offset = 0;
  }
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(in,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    if (*line._M_dataplus._M_p != '%') {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::emplace_back<>(__return_storage_ptr__);
      pvVar1 = (__return_storage_ptr__->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::istringstream::istringstream((istringstream *)&lin,(string *)&line,_S_in);
      token._M_dataplus._M_p = (pointer)&token.field_2;
      token._M_string_length = 0;
      token.field_2._M_local_buf[0] = '\0';
      iVar3 = col_offset;
      while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
        std::operator>>((istream *)&lin,(string *)&token);
      }
      while( true ) {
        piVar2 = std::operator>>((istream *)&lin,(string *)&token);
        if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
        local_1f8 = std::__cxx11::stod(&token,(size_t *)0x0);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(pvVar1 + -1,&local_1f8);
      }
      std::__cxx11::string::~string((string *)&token);
      std::__cxx11::istringstream::~istringstream((istringstream *)&lin);
    }
  }
  std::__cxx11::string::~string((string *)&line);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Container> load(std::istream& in, int col_offset)
{
    std::vector<Container> points;
    std::string line;
    while (std::getline(in, line))
    {
        if (line[0] == '%')
            continue;
        points.emplace_back();
        auto& point = points.back();
        std::istringstream lin(line);
        std::string token;
        for (int i = 0; i < col_offset; i++)
            lin >> token;
        while (lin >> token)
            point.push_back(std::stod(token));
    }
    return points;
}